

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int constfolding(FuncState *fs,int op,expdesc *e1,expdesc *e2)

{
  int iVar1;
  lua_Number n;
  TValue res;
  TValue v2;
  TValue v1;
  expdesc *e2_local;
  expdesc *e1_local;
  int op_local;
  FuncState *fs_local;
  
  iVar1 = tonumeral(e1,(TValue *)&v2.tt_);
  if (((iVar1 == 0) || (iVar1 = tonumeral(e2,(TValue *)&res.tt_), iVar1 == 0)) ||
     (iVar1 = validop(op,(TValue *)&v2.tt_,(TValue *)&res.tt_), iVar1 == 0)) {
    fs_local._4_4_ = 0;
  }
  else {
    luaO_arith(fs->ls->L,op,(TValue *)&v2.tt_,(TValue *)&res.tt_,(TValue *)&n);
    if (res.value_.b == 0x13) {
      e1->k = VKINT;
      (e1->u).nval = n;
    }
    else {
      if ((NAN(n)) || ((n == 0.0 && (!NAN(n))))) {
        return 0;
      }
      e1->k = VKFLT;
      (e1->u).nval = n;
    }
    fs_local._4_4_ = 1;
  }
  return fs_local._4_4_;
}

Assistant:

static int constfolding (FuncState *fs, int op, expdesc *e1,
                                                const expdesc *e2) {
  TValue v1, v2, res;
  if (!tonumeral(e1, &v1) || !tonumeral(e2, &v2) || !validop(op, &v1, &v2))
    return 0;  /* non-numeric operands or not safe to fold */
  luaO_arith(fs->ls->L, op, &v1, &v2, &res);  /* does operation */
  if (ttisinteger(&res)) {
    e1->k = VKINT;
    e1->u.ival = ivalue(&res);
  }
  else {  /* folds neither NaN nor 0.0 (to avoid problems with -0.0) */
    lua_Number n = fltvalue(&res);
    if (luai_numisnan(n) || n == 0)
      return 0;
    e1->k = VKFLT;
    e1->u.nval = n;
  }
  return 1;
}